

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

CollectorResult __thiscall
Simple::Lib::
ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
::emit(ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int args_1)

{
  SignalLink *this_00;
  bool bVar1;
  CbFunction *cbf;
  SignalLink *old;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  SignalLink *pSStack_28;
  bool continue_emission;
  SignalLink *link;
  CollectorDefault<void> collector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  int args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
  *this_local;
  
  link._4_4_ = args_1;
  pbStack_18 = args;
  if (this->callback_ring_ == (SignalLink *)0x0) {
    CollectorDefault<void>::result((CollectorDefault<void> *)((long)&link + 3));
  }
  else {
    pSStack_28 = this->callback_ring_;
    SignalLink::incref(pSStack_28);
    do {
      bVar1 = std::operator!=(&pSStack_28->function,(nullptr_t)0x0);
      if (bVar1) {
        cbf = &pSStack_28->function;
        std::__cxx11::string::string((string *)&local_50,(string *)args);
        bVar1 = CollectorInvocation<Simple::Lib::CollectorDefault<void>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
                ::invoke((CollectorInvocation<Simple::Lib::CollectorDefault<void>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
                          *)this,(CollectorDefault<void> *)((long)&link + 3),cbf,&local_50,
                         link._4_4_);
        std::__cxx11::string::~string((string *)&local_50);
        local_29 = bVar1;
        if (!bVar1) break;
      }
      this_00 = pSStack_28;
      pSStack_28 = pSStack_28->next;
      SignalLink::incref(pSStack_28);
      SignalLink::decref(this_00);
    } while (pSStack_28 != this->callback_ring_);
    SignalLink::decref(pSStack_28);
    CollectorDefault<void>::result((CollectorDefault<void> *)((long)&link + 3));
  }
  return;
}

Assistant:

CollectorResult
  emit (Args... args)
  {
    Collector collector;
    if (!callback_ring_)
      return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do
      {
        if (link->function != nullptr)
          {
            const bool continue_emission = this->invoke (collector, link->function, args...);
            if (!continue_emission)
              break;
          }
        SignalLink *old = link;
        link = old->next;
        link->incref();
        old->decref();
      }
    while (link != callback_ring_);
    link->decref();
    return collector.result();
  }